

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
          *field)

{
  pointer pEVar1;
  ulong uVar2;
  string *__args;
  size_type sVar3;
  unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> local_60;
  value_type local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_true>
  local_50;
  Binding local_48;
  value_type local_20;
  ElemSegment *elem_segment;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  *field_local;
  Module *this_local;
  
  elem_segment = (ElemSegment *)field;
  field_local = (unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                 *)this;
  pEVar1 = std::
           unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
           ::operator->(field);
  local_20 = &pEVar1->elem_segment;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __args = &local_20->name;
    pEVar1 = std::
             unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
             ::operator->(field);
    sVar3 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::size
                      (&this->elem_segments);
    Binding::Binding(&local_48,
                     &(pEVar1->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField.
                      loc,(Index)sVar3);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
         ::emplace<std::__cxx11::string&,wabt::Binding>
                   ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                     *)&this->elem_segment_bindings,__args,&local_48);
  }
  local_58 = local_20;
  std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::push_back
            (&this->elem_segments,&local_58);
  std::unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>>::
  unique_ptr<wabt::ElemSegmentModuleField,std::default_delete<wabt::ElemSegmentModuleField>,void>
            ((unique_ptr<wabt::ModuleField,std::default_delete<wabt::ModuleField>> *)&local_60,field
            );
  intrusive_list<wabt::ModuleField>::push_back(&this->fields,&local_60);
  std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::~unique_ptr
            (&local_60);
  return;
}

Assistant:

void Module::AppendField(std::unique_ptr<ElemSegmentModuleField> field) {
  ElemSegment& elem_segment = field->elem_segment;
  if (!elem_segment.name.empty()) {
    elem_segment_bindings.emplace(elem_segment.name,
                                  Binding(field->loc, elem_segments.size()));
  }
  elem_segments.push_back(&elem_segment);
  fields.push_back(std::move(field));
}